

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

uint * __thiscall cimg_library::CImg<unsigned_int>::min(CImg<unsigned_int> *this)

{
  uint *puVar1;
  uint *puVar2;
  CImgInstanceException *this_00;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  char *pcVar6;
  
  puVar2 = this->_data;
  if ((((puVar2 != (uint *)0x0) && (this->_width != 0)) && (this->_height != 0)) &&
     ((this->_depth != 0 && (this->_spectrum != 0)))) {
    lVar4 = (ulong)this->_spectrum * (ulong)this->_depth *
            (ulong)this->_height * (ulong)this->_width;
    if (0 < lVar4) {
      puVar1 = puVar2 + lVar4;
      uVar3 = *puVar2;
      puVar5 = puVar2;
      do {
        if (*puVar5 < uVar3) {
          puVar2 = puVar5;
          uVar3 = *puVar5;
        }
        puVar5 = puVar5 + 1;
      } while (puVar5 < puVar1);
    }
    return puVar2;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
  pcVar6 = "non-";
  if (this->_is_shared != false) {
    pcVar6 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::min(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar6,"unsigned int");
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,CImgException::~CImgException);
}

Assistant:

const T& min() const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_min = _data;
      T min_value = *ptr_min;
      cimg_for(*this,ptrs,T) if (*ptrs<min_value) min_value = *(ptr_min=ptrs);
      return *ptr_min;
    }